

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

_Bool fs_stdio_open_directory(ALLEGRO_FS_ENTRY *fp)

{
  DIR *pDVar1;
  long in_RDI;
  ALLEGRO_FS_ENTRY_STDIO *fp_stdio;
  undefined1 local_1;
  
  if ((*(uint *)(in_RDI + 0x10) & 0x20) == 0) {
    local_1 = false;
  }
  else {
    pDVar1 = opendir(*(char **)(in_RDI + 8));
    *(DIR **)(in_RDI + 0xa8) = pDVar1;
    if (*(long *)(in_RDI + 0xa8) == 0) {
      __errno_location();
      al_set_errno((int)((ulong)in_RDI >> 0x20));
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool fs_stdio_open_directory(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;

   if (!(fp_stdio->stat_mode & ALLEGRO_FILEMODE_ISDIR))
      return false;

   fp_stdio->dir = WRAP_OPENDIR(fp_stdio->abs_path);
   if (!fp_stdio->dir) {
      al_set_errno(errno);
      return false;
   }

   return true;
}